

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_SetTxInSequence_Test::TestBody
          (ConfidentialTransaction_SetTxInSequence_Test *this)

{
  char *message;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  string local_88;
  ConfidentialTransaction tx;
  string tx_hex;
  
  std::__cxx11::string::string
            ((string *)&tx_hex,
             "020000000101319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100008000ffffffff6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f36f2a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f301000000000011223301000000000011224400000000000800110011001100110800110011001100220000"
             ,(allocator *)&tx);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,&tx_hex);
  cfd::core::ConfidentialTransaction::SetTxInSequence(&tx,0,0xfffffffe);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_88,&tx.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<char[309],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"020000000101319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100008000feffffff6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f36f2a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f301000000000011223301000000000011224400000000000800110011001100110800110011001100220000\""
             ,"tx.GetHex()",
             (char (*) [309])
             "020000000101319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100008000feffffff6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f36f2a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f301000000000011223301000000000011224400000000000800110011001100110800110011001100220000"
             ,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7c7,message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  std::__cxx11::string::~string((string *)&tx_hex);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetTxInSequence) {
  std::string tx_hex = "020000000101319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100008000ffffffff6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f36f2a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f301000000000011223301000000000011224400000000000800110011001100110800110011001100220000";
  ConfidentialTransaction tx(tx_hex);
  tx.SetTxInSequence(0, 4294967294);
  EXPECT_EQ(
      "020000000101319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100008000feffffff6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f36f2a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f301000000000011223301000000000011224400000000000800110011001100110800110011001100220000",
      tx.GetHex());
}